

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O3

void __thiscall
kj::_::AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter>::fulfill
          (AdapterPromiseNode<siginfo_t,_kj::UnixEventPort::SignalPromiseAdapter> *this,
          anon_struct_128_5_975a5653_for_value *value)

{
  long lVar1;
  anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *paVar2;
  ExceptionOr<siginfo_t> local_228;
  
  if (this->waiting == true) {
    this->waiting = false;
    paVar2 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)&local_228.value;
    local_228.super_ExceptionOrValue.exception.ptr.isSet = false;
    local_228.value.ptr.isSet = true;
    for (lVar1 = 0x10;
        paVar2 = (anon_union_128_1_a8c68091_for_NullableValue<siginfo_t>_2 *)((long)paVar2 + 8),
        lVar1 != 0; lVar1 = lVar1 + -1) {
      *(undefined8 *)paVar2 = *(undefined8 *)value;
      value = (anon_struct_128_5_975a5653_for_value *)&value->si_code;
    }
    ExceptionOr<siginfo_t>::operator=(&this->result,&local_228);
    if (local_228.super_ExceptionOrValue.exception.ptr.isSet == true) {
      Exception::~Exception(&local_228.super_ExceptionOrValue.exception.ptr.field_1.value);
    }
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }